

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcServer.cpp
# Opt level: O0

void __thiscall XmlRpc::XmlRpcServer::enableIntrospection(XmlRpcServer *this,bool enabled)

{
  byte bVar1;
  ListMethods *this_00;
  XmlRpcServer *s;
  byte in_SIL;
  XmlRpcServerMethod *in_RDI;
  XmlRpcServer *in_stack_ffffffffffffffc8;
  XmlRpcServer *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  if (((in_RDI->_name).field_0x6 & 1) != bVar1) {
    (in_RDI->_name).field_0x6 = bVar1;
    if (bVar1 == 0) {
      removeMethod((XmlRpcServer *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff),
                   in_stack_ffffffffffffffe8);
      removeMethod((XmlRpcServer *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                   in_stack_ffffffffffffffe8);
    }
    else if (*(long *)&in_RDI[2]._name == 0) {
      this_00 = (ListMethods *)operator_new(0x30);
      ListMethods::ListMethods(this_00,in_stack_ffffffffffffffc8);
      *(ListMethods **)&in_RDI[2]._name = this_00;
      s = (XmlRpcServer *)operator_new(0x30);
      MethodHelp::MethodHelp((MethodHelp *)this_00,s);
      in_RDI[2]._name._M_string_length = (size_type)s;
    }
    else {
      addMethod(in_stack_ffffffffffffffe0,in_RDI);
      addMethod(in_stack_ffffffffffffffe0,in_RDI);
    }
  }
  return;
}

Assistant:

void XmlRpcServer::enableIntrospection(bool enabled)
{
  if (_introspectionEnabled == enabled)
    return;

  _introspectionEnabled = enabled;

  if (enabled)
  {
    if ( ! _listMethods)
    {
      _listMethods = new ListMethods(this);
      _methodHelp = new MethodHelp(this);
    } else {
      addMethod(_listMethods);
      addMethod(_methodHelp);
    }
  }
  else
  {
    removeMethod(LIST_METHODS);
    removeMethod(METHOD_HELP);
  }
}